

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O1

size_t tinyusdz::Usd_IntegerCompression64::CompressToBuffer
                 (uint64_t *ints,size_t numInts,char *compressed,string *err)

{
  uint64_t *input;
  long lVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  bool bVar10;
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  counts;
  uint64_t local_88;
  uint64_t *local_80;
  char *local_78;
  string *local_70;
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (numInts == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (numInts * 2 + 7 >> 3) + numInts * 8 + 8;
  }
  input = (uint64_t *)operator_new__(uVar6);
  if (numInts == 0) {
    sVar4 = 0;
  }
  else {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    lVar5 = 0;
    lVar1 = 0;
    uVar6 = 0;
    uVar8 = 0;
    local_80 = input;
    local_78 = compressed;
    local_70 = err;
    do {
      local_88 = *(long *)((long)ints + lVar5) - lVar1;
      pmVar2 = ::std::__detail::
               _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)&local_88);
      uVar3 = *pmVar2 + 1;
      *pmVar2 = uVar3;
      bVar10 = uVar3 == uVar6;
      uVar9 = local_88;
      if (((uVar3 <= uVar6) && (uVar3 = uVar6, uVar9 = uVar8, bVar10)) &&
         ((long)uVar8 < (long)local_88)) {
        uVar9 = local_88;
      }
      lVar1 = *(long *)((long)ints + lVar5);
      lVar5 = lVar5 + 8;
      uVar6 = uVar3;
      uVar8 = uVar9;
    } while (numInts * 8 - lVar5 != 0);
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    *local_80 = uVar9;
    sVar4 = (numInts * 2 + 7 >> 3) + 8;
    switch(numInts) {
    case 0:
      err = local_70;
      compressed = local_78;
      input = local_80;
      break;
    case 1:
      uVar8 = *ints;
      uVar6 = 0;
      if ((uVar8 != uVar9) && (uVar6 = 1, (long)(short)uVar8 != uVar8)) {
        uVar6 = (ulong)((uVar8 - 0x80000000 < 0xffffffff00000000) + 2);
      }
      sVar4 = (*(code *)((long)&DAT_0040c4c8 + (long)(int)(&DAT_0040c4c8)[uVar6]))
                        (uVar6,(code *)((long)&DAT_0040c4c8 + (long)(int)(&DAT_0040c4c8)[uVar6]));
      return sVar4;
    case 2:
      uVar8 = *ints;
      uVar7 = 0;
      if ((uVar8 != uVar9) && (uVar7 = 1, (long)(short)uVar8 != uVar8)) {
        uVar7 = (uVar8 - 0x80000000 < 0xffffffff00000000) + 2;
      }
      sVar4 = (*(code *)((long)&DAT_0040c4b8 + (long)(int)(&DAT_0040c4b8)[uVar7]))(0);
      return sVar4;
    case 3:
      uVar8 = *ints;
      uVar7 = 0;
      if ((uVar8 != uVar9) && (uVar7 = 1, (long)(short)uVar8 != uVar8)) {
        uVar7 = (uVar8 - 0x80000000 < 0xffffffff00000000) + 2;
      }
      sVar4 = (*(code *)((long)&DAT_0040c4d8 + (long)(int)(&DAT_0040c4d8)[uVar7]))(0);
      return sVar4;
    default:
      uVar8 = *ints;
      uVar7 = 0;
      if ((uVar8 != uVar9) && (uVar7 = 1, (long)(short)uVar8 != uVar8)) {
        uVar7 = (uVar8 - 0x80000000 < 0xffffffff00000000) + 2;
      }
      sVar4 = (*(code *)((long)&DAT_0040c498 + (long)(int)(&DAT_0040c498)[uVar7]))();
      return sVar4;
    }
  }
  sVar4 = LZ4Compression::CompressToBuffer((char *)input,compressed,sVar4,err);
  operator_delete__(input);
  return sVar4;
}

Assistant:

size_t
Usd_IntegerCompression64::CompressToBuffer(
    uint64_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}